

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O2

void __thiscall wasm::PostEmscripten::removeExports(PostEmscripten *this,Module *module)

{
  pointer puVar1;
  Global *pGVar2;
  pointer puVar3;
  Function *pFVar4;
  __uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> _Var5;
  undefined8 *puVar6;
  pointer puVar7;
  DataSegment *pDVar8;
  __uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> __k;
  int *piVar9;
  PassRunner *pPVar10;
  bool bVar11;
  iterator iVar12;
  undefined8 *puVar13;
  value_type *__x;
  uint uVar14;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar15;
  pointer puVar16;
  pointer puVar17;
  pointer puVar18;
  undefined1 auStack_268 [8];
  OffsetSearcher searcher;
  unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
  passiveOffsets;
  string_view local_130;
  string_view local_120;
  string_view local_110;
  string_view local_100;
  string_view local_f0;
  string_view local_e0;
  string_view local_d0;
  string_view local_c0;
  string_view local_b0;
  string_view local_a0;
  string_view local_90;
  string_view local_80;
  Expression *local_70;
  value_type local_68;
  Address UNKNOWN_OFFSET;
  undefined1 auStack_48 [8];
  vector<wasm::Address,_std::allocator<wasm::Address>_> segmentOffsets;
  
  segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_48 = (undefined1  [8])0x0;
  segmentOffsets.super__Vector_base<wasm::Address,_std::allocator<wasm::Address>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.addr = 0xffffffff;
  searcher.offsets =
       (unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
        *)&passiveOffsets._M_h._M_rehash_policy._M_next_resize;
  passiveOffsets._M_h._M_buckets = (__buckets_ptr)0x1;
  passiveOffsets._M_h._M_bucket_count = 0;
  passiveOffsets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  passiveOffsets._M_h._M_element_count._0_4_ = 0x3f800000;
  passiveOffsets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  passiveOffsets._M_h._M_rehash_policy._4_4_ = 0;
  passiveOffsets._M_h._M_rehash_policy._M_next_resize = 0;
  if (((module->features).features & 0x10) != 0) {
    auStack_268 = (undefined1  [8])0x0;
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.replacep = (Expression **)0x0
    ;
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack.fixed._M_elems[9].currp
         = (Expression **)0x0;
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task,_std::allocator<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task,_std::allocator<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task,_std::allocator<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.currModule =
         (Module *)&searcher.offsets;
    puVar1 = (module->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.currFunction =
         (Function *)module;
    for (puVar15 = (module->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar1;
        puVar15 = puVar15 + 1) {
      pGVar2 = (puVar15->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar2->super_Importable).module + 8) == (char *)0x0) {
        Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::walk
                  ((Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_> *)auStack_268,
                   &pGVar2->init);
      }
    }
    puVar3 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar3;
        puVar16 = puVar16 + 1) {
      pFVar4 = (puVar16->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar4->super_Importable).module + 8) == (char *)0x0) {
        searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
        super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task,_std::allocator<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pFVar4;
        Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::walk
                  ((Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_> *)auStack_268,
                   &pFVar4->body);
        searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
        super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task,_std::allocator<wasm::Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
    }
    UNKNOWN_OFFSET.addr =
         (address64_t)
         (module->elementSegments).
         super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar17 = (module->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        puVar17 != (pointer)UNKNOWN_OFFSET.addr; puVar17 = puVar17 + 1) {
      _Var5._M_t.
      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
      super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
           (puVar17->_M_t).
           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
           _M_t;
      if (*(long *)((long)_Var5._M_t.
                          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x20)
          != 0) {
        Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::walk
                  ((Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_> *)auStack_268,
                   (Expression **)
                   ((long)_Var5._M_t.
                          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x28)
                  );
      }
      puVar6 = *(undefined8 **)
                ((long)_Var5._M_t.
                       super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                       .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x40);
      for (puVar13 = *(undefined8 **)
                      ((long)_Var5._M_t.
                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl +
                      0x38); puVar13 != puVar6; puVar13 = puVar13 + 1) {
        local_70 = (Expression *)*puVar13;
        Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::walk
                  ((Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_> *)auStack_268,
                   &local_70);
      }
    }
    puVar7 = (module->dataSegments).
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar18 = (module->dataSegments).
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar7;
        puVar18 = puVar18 + 1) {
      pDVar8 = (puVar18->_M_t).
               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
               _M_t.
               super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
               super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if (pDVar8->isPassive == false) {
        Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::walk
                  ((Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_> *)auStack_268,
                   &pDVar8->offset);
      }
    }
    searcher.super_PostWalker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.
    super_Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>.currFunction =
         (Function *)0x0;
    Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_>::~Walker
              ((Walker<OffsetSearcher,_wasm::Visitor<OffsetSearcher,_void>_> *)auStack_268);
  }
  uVar14 = 0;
  while( true ) {
    puVar18 = (module->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->dataSegments).
                      super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar18 >> 3) <=
        (ulong)uVar14) break;
    __k._M_t.super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
    super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
         puVar18[uVar14]._M_t.
         super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t;
    if (*(char *)&(((key_type *)
                   ((long)__k._M_t.
                          super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                          .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x20))->
                  super_IString).str._M_str == '\x01') {
      iVar12 = std::
               _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&searcher.offsets,
                      (key_type *)
                      __k._M_t.
                      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                      .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl);
      __x = (value_type *)
            ((long)iVar12.
                   super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true>.
                   _M_cur + 0x18);
      if (iVar12.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true>._M_cur
          == (__node_type *)0x0) {
        __x = &local_68;
      }
      std::vector<wasm::Address,_std::allocator<wasm::Address>_>::push_back
                ((vector<wasm::Address,_std::allocator<wasm::Address>_> *)auStack_48,__x);
    }
    else {
      piVar9 = (int *)(((key_type *)
                       ((long)__k._M_t.
                              super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                              .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x30
                       ))->super_IString).str._M_len;
      if (*piVar9 == 0xe) {
        auStack_268 = (undefined1  [8])Literal::getUnsigned((Literal *)(piVar9 + 4));
        std::vector<wasm::Address,_std::allocator<wasm::Address>_>::emplace_back<wasm::Address>
                  ((vector<wasm::Address,_std::allocator<wasm::Address>_> *)auStack_48,
                   (Address *)auStack_268);
      }
      else {
        auStack_268 = (undefined1  [8])0x0;
        std::vector<wasm::Address,_std::allocator<wasm::Address>_>::emplace_back<wasm::Address>
                  ((vector<wasm::Address,_std::allocator<wasm::Address>_> *)auStack_48,
                   (Address *)auStack_268);
      }
    }
    uVar14 = uVar14 + 1;
  }
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Address>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&searcher.offsets);
  pPVar10 = (this->super_Pass).runner;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&passiveOffsets._M_h._M_single_bucket,"post-emscripten-side-module",
             (allocator<char> *)auStack_268);
  bVar11 = PassOptions::hasArgument
                     (&pPVar10->options,(string *)&passiveOffsets._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)&passiveOffsets._M_h._M_single_bucket);
  if (!bVar11) {
    Name::Name((Name *)&local_130,"__start_em_asm");
    Name::Name((Name *)&local_120,"__stop_em_asm");
    anon_unknown_0::removeData
              (module,(vector<wasm::Address,_std::allocator<wasm::Address>_> *)auStack_48,
               (Name)local_130,(Name)local_120);
    Name::Name((Name *)&local_110,"__start_em_asm");
    Module::removeExport(module,(Name)local_110);
    Name::Name((Name *)&local_100,"__stop_em_asm");
    Module::removeExport(module,(Name)local_100);
  }
  Name::Name((Name *)&local_f0,"__start_em_js");
  Name::Name((Name *)&local_e0,"__stop_em_js");
  anon_unknown_0::removeData
            (module,(vector<wasm::Address,_std::allocator<wasm::Address>_> *)auStack_48,
             (Name)local_f0,(Name)local_e0);
  Name::Name((Name *)&local_d0,"__start_em_lib_deps");
  Name::Name((Name *)&local_c0,"__stop_em_lib_deps");
  anon_unknown_0::removeData
            (module,(vector<wasm::Address,_std::allocator<wasm::Address>_> *)auStack_48,
             (Name)local_d0,(Name)local_c0);
  Name::Name((Name *)&local_b0,"__start_em_js");
  Module::removeExport(module,(Name)local_b0);
  Name::Name((Name *)&local_a0,"__stop_em_js");
  Module::removeExport(module,(Name)local_a0);
  Name::Name((Name *)&local_90,"__start_em_lib_deps");
  Module::removeExport(module,(Name)local_90);
  Name::Name((Name *)&local_80,"__stop_em_lib_deps");
  Module::removeExport(module,(Name)local_80);
  std::_Vector_base<wasm::Address,_std::allocator<wasm::Address>_>::~_Vector_base
            ((_Vector_base<wasm::Address,_std::allocator<wasm::Address>_> *)auStack_48);
  return;
}

Assistant:

void removeExports(Module& module) {
    std::vector<Address> segmentOffsets; // segment index => address offset
    calcSegmentOffsets(module, segmentOffsets);

    auto& options = getPassOptions();
    auto sideModule = options.hasArgument("post-emscripten-side-module");
    if (!sideModule) {
      // Side modules read EM_ASM data from the module based on these exports
      // so we need to keep them around in that case.
      removeData(module, segmentOffsets, "__start_em_asm", "__stop_em_asm");
      module.removeExport("__start_em_asm");
      module.removeExport("__stop_em_asm");
    }

    removeData(module, segmentOffsets, "__start_em_js", "__stop_em_js");
    removeData(
      module, segmentOffsets, "__start_em_lib_deps", "__stop_em_lib_deps");
    module.removeExport("__start_em_js");
    module.removeExport("__stop_em_js");
    module.removeExport("__start_em_lib_deps");
    module.removeExport("__stop_em_lib_deps");
  }